

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddBox
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double hx,
          double hy,double hz,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  shared_ptr<chrono::ChMaterialSurface> local_48;
  cbtVector3 local_38;
  
  dVar6 = hx;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar7._0_8_ = (double)SUB84(dVar6,0);
  auVar7._8_8_ = in_XMM0_Qb;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = hx;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = hy;
  auVar1 = vminsd_avx(auVar8,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = hz;
  auVar1 = vminsd_avx(auVar1,auVar2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar7,auVar9);
  fVar3 = auVar1._0_4_;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,BOX,&local_48);
  if (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar4 = (float)((double)fVar3 + hx);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar5 = (float)((double)fVar4 + hy);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtAlignedAllocInternal(0x50,0x10);
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[0] = (float)((double)fVar3 + hx);
  local_38.m_floats[1] = (float)((double)fVar4 + hy);
  local_38.m_floats[2] = (float)((double)fVar5 + hz);
  cbtBoxShape::cbtBoxShape((cbtBoxShape *)this_01,&local_38);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddBox(std::shared_ptr<ChMaterialSurface> material,
                                    double hx,
                                    double hy,
                                    double hz,
                                    const ChVector<>& pos,
                                    const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(hx, hy), hz)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::BOX, material);

    cbtScalar ahx = (cbtScalar)(hx + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    cbtScalar ahz = (cbtScalar)(hz + GetEnvelope());
    shape->m_bt_shape = new cbtBoxShape(cbtVector3(ahx, ahy, ahz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}